

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-capability.c++:90:13)>
::getImpl(SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_dynamic_capability_c__:90:13)>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<capnp::Response<capnp::AnyPointer>_> depResult;
  Response<capnp::DynamicStruct> local_410;
  ExceptionOr<capnp::Response<capnp::AnyPointer>_> local_3c8;
  ExceptionOr<capnp::Response<capnp::DynamicStruct>_> local_1f8;
  
  local_3c8.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_3c8.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&local_3c8.super_ExceptionOrValue);
  if (local_3c8.super_ExceptionOrValue.exception.ptr.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_1f8,
               &local_3c8.super_ExceptionOrValue.exception.ptr.field_1.value);
    local_1f8.value.ptr.isSet = false;
    ExceptionOr<capnp::Response<capnp::DynamicStruct>_>::operator=
              ((ExceptionOr<capnp::Response<capnp::DynamicStruct>_> *)output,&local_1f8);
    ExceptionOr<capnp::Response<capnp::DynamicStruct>_>::~ExceptionOr(&local_1f8);
  }
  else if (local_3c8.value.ptr.isSet == true) {
    anon_class_8_1_9705db31_for_func::operator()
              (&local_410,&this->func,&local_3c8.value.ptr.field_1.value);
    local_1f8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_1f8.value.ptr.isSet = true;
    local_1f8.value.ptr.field_1.value.super_Reader.schema.super_Schema.raw =
         (StructSchema)(StructSchema)local_410.super_Reader.schema.super_Schema.raw;
    local_1f8.value.ptr.field_1.value.super_Reader.reader.segment =
         local_410.super_Reader.reader.segment;
    local_1f8.value.ptr.field_1.value.super_Reader.reader.capTable =
         local_410.super_Reader.reader.capTable;
    local_1f8.value.ptr.field_1.value.super_Reader.reader.data = local_410.super_Reader.reader.data;
    local_1f8.value.ptr.field_1.value.super_Reader.reader.pointers =
         local_410.super_Reader.reader.pointers;
    local_1f8.value.ptr.field_1.value.super_Reader.reader.dataSize =
         local_410.super_Reader.reader.dataSize;
    local_1f8.value.ptr.field_1.value.super_Reader.reader.pointerCount =
         local_410.super_Reader.reader.pointerCount;
    local_1f8.value.ptr.field_1._46_2_ = local_410.super_Reader.reader._38_2_;
    local_1f8.value.ptr.field_1._48_8_ = local_410.super_Reader.reader._40_8_;
    local_1f8.value.ptr.field_1.value.hook.disposer = local_410.hook.disposer;
    local_1f8.value.ptr.field_1.value.hook.ptr = local_410.hook.ptr;
    local_410.hook.ptr = (ResponseHook *)0x0;
    ExceptionOr<capnp::Response<capnp::DynamicStruct>_>::operator=
              ((ExceptionOr<capnp::Response<capnp::DynamicStruct>_> *)output,&local_1f8);
    ExceptionOr<capnp::Response<capnp::DynamicStruct>_>::~ExceptionOr(&local_1f8);
    Own<capnp::ResponseHook,_std::nullptr_t>::dispose(&local_410.hook);
  }
  ExceptionOr<capnp::Response<capnp::AnyPointer>_>::~ExceptionOr(&local_3c8);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }